

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O0

void anon_unknown.dwarf_108296::compressVerify(unsigned_short *raw,int n,uint dekHash)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  void *pvVar4;
  uint in_EDX;
  int in_ESI;
  ushort *in_RDI;
  int i_1;
  uchar *cptr_1;
  int i;
  uchar *cptr;
  uint compressedHash;
  int nCompressed;
  Array<char> compressed;
  long in_stack_ffffffffffffff58;
  Array<char> *in_stack_ffffffffffffff60;
  uint local_54;
  byte *local_50;
  int local_44;
  byte *local_40;
  uint local_38;
  Array local_20 [16];
  uint local_10;
  int local_c;
  ushort *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Imf_3_2::Array<char>::Array(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pcVar2 = Imf_3_2::Array::operator_cast_to_char_(local_20);
  uVar1 = Imf_3_2::hufCompress(local_8,local_c,pcVar2);
  local_40 = (byte *)Imf_3_2::Array::operator_cast_to_char_(local_20);
  local_38 = uVar1;
  for (local_44 = 0; local_44 < (int)uVar1; local_44 = local_44 + 1) {
    local_38 = local_38 << 5 ^ local_38 >> 0x1b ^ (uint)*local_40;
    local_40 = local_40 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"verifying compressed checksum hash = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_38);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  if (local_38 != local_10) {
    poVar3 = std::operator<<((ostream *)&std::cout,"hash verification failed. Got ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
    poVar3 = std::operator<<(poVar3," expected ");
    in_stack_ffffffffffffff60 = (Array<char> *)std::ostream::operator<<(poVar3,local_10);
    std::ostream::operator<<(in_stack_ffffffffffffff60,std::endl<char,std::char_traits<char>>);
    local_50 = (byte *)Imf_3_2::Array::operator_cast_to_char_(local_20);
    for (local_54 = 0; (int)local_54 < (int)uVar1; local_54 = local_54 + 1) {
      pvVar4 = (void *)std::ostream::operator<<(&std::cout,std::hex);
      std::ostream::operator<<(pvVar4,(uint)*local_50);
      if ((local_54 & 0xf) == 0) {
        std::operator<<((ostream *)&std::cout,'\n');
      }
      else {
        std::operator<<((ostream *)&std::cout,' ');
      }
      local_50 = local_50 + 1;
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  if (local_38 == local_10) {
    Imf_3_2::Array<char>::~Array(in_stack_ffffffffffffff60);
    return;
  }
  __assert_fail("compressedHash == dekHash",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                ,0xcd,
                "void (anonymous namespace)::compressVerify(const unsigned short *, int, const unsigned int)"
               );
}

Assistant:

void
compressVerify (const unsigned short raw[], int n, const unsigned int dekHash)
{
    Array<char> compressed (3 * n + 4 * 65536);

    int nCompressed = hufCompress (raw, n, compressed);

    //
    // This hash algorithm proposed by Donald E. Knuth in
    // The Art Of Computer Programming Volume 3,
    // under the topic of sorting and search chapter 6.4.
    //
    unsigned int         compressedHash = nCompressed;
    const unsigned char* cptr =
        reinterpret_cast<const unsigned char*> ((const char*) compressed);
    for (int i = 0; i < nCompressed; ++i)
    {
        compressedHash =
            ((compressedHash << 5) ^ (compressedHash >> 27)) ^ (*cptr++);
    }

    cout << "verifying compressed checksum hash = " << compressedHash
         << std::endl;

    if (compressedHash != dekHash)
    {
        cout << "hash verification failed. Got " << compressedHash
             << " expected " << dekHash << std::endl;
        const unsigned char* cptr =
            reinterpret_cast<const unsigned char*> ((const char*) compressed);
        for (int i = 0; i < nCompressed; ++i)
        {
            cout << std::hex << (0xFF & (int) (*cptr++));
            if ((i & 0xF) == 0) { cout << '\n'; }
            else
            {
                cout << ' ';
            }
        }
        cout << "\n";
    }

    assert (compressedHash == dekHash);
}